

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void __thiscall
Assimp::glTFExporter::GetMatColorOrTex
          (glTFExporter *this,aiMaterial *mat,TexProperty *prop,char *propName,int type,int idx,
          aiTextureType tt)

{
  aiTexture **ppaVar1;
  aiTexture *paVar2;
  undefined8 data_00;
  bool bVar3;
  uint uVar4;
  aiReturn aVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  pointer ppVar9;
  element_type *peVar10;
  mapped_type_conflict3 *pmVar11;
  Texture *pTVar12;
  Image *pIVar13;
  Ref<glTF::Texture> RVar14;
  Ref<glTF::Image> RVar15;
  char *local_698;
  allocator local_5b1;
  string local_5b0 [8];
  string mimeType;
  uint8_t *data;
  aiTexture *tex_1;
  allocator local_559;
  string local_558;
  undefined1 local_538 [8];
  string imgId;
  allocator local_4f1;
  string local_4f0;
  undefined1 local_4d0 [8];
  string texId;
  _Self local_490;
  _Self local_488;
  iterator it;
  allocator local_469;
  undefined1 local_468 [8];
  string path;
  float local_440;
  aiColor4D col;
  aiString tex;
  int idx_local;
  int type_local;
  char *propName_local;
  TexProperty *prop_local;
  aiMaterial *mat_local;
  glTFExporter *this_local;
  
  aiString::aiString((aiString *)&col.b);
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)((long)&path.field_2 + 0xc));
  uVar4 = aiMaterial::GetTextureCount(mat,tt);
  if ((uVar4 != 0) &&
     (aVar5 = aiMaterial::Get(mat,"$tex.file",tt,0,(aiString *)&col.b), aVar5 == aiReturn_SUCCESS))
  {
    pcVar7 = aiString::C_Str((aiString *)&col.b);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_468,pcVar7,&local_469);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    lVar8 = std::__cxx11::string::size();
    if (lVar8 != 0) {
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_468);
      if (*pcVar7 != '*') {
        local_488._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find(&this->mTexturesByPath,(key_type *)local_468);
        local_490._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::end(&this->mTexturesByPath);
        bVar3 = std::operator!=(&local_488,&local_490);
        if (bVar3) {
          peVar10 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->mAsset);
          ppVar9 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                   ::operator->(&local_488);
          RVar14 = glTF::LazyDict<glTF::Texture>::Get(&peVar10->textures,ppVar9->second);
          texId.field_2._8_8_ = RVar14.vector;
          (prop->texture).vector =
               (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)texId.field_2._8_8_;
          (prop->texture).index = RVar14.index;
        }
      }
      bVar3 = glTF::Ref::operator_cast_to_bool((Ref *)prop);
      if (!bVar3) {
        peVar10 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mAsset);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_4f0,"",&local_4f1);
        glTF::Asset::FindUniqueID((string *)local_4d0,peVar10,&local_4f0,"texture");
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
        peVar10 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mAsset);
        RVar14 = glTF::LazyDict<glTF::Texture>::Create(&peVar10->textures,(string *)local_4d0);
        imgId.field_2._8_8_ = RVar14.vector;
        (prop->texture).index = RVar14.index;
        (prop->texture).vector =
             (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)imgId.field_2._8_8_;
        uVar4 = glTF::Ref<glTF::Texture>::GetIndex(&prop->texture);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[](&this->mTexturesByPath,(key_type *)local_468);
        *pmVar11 = uVar4;
        peVar10 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mAsset);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_558,"",&local_559);
        glTF::Asset::FindUniqueID((string *)local_538,peVar10,&local_558,"image");
        std::__cxx11::string::~string((string *)&local_558);
        std::allocator<char>::~allocator((allocator<char> *)&local_559);
        peVar10 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mAsset);
        RVar15 = glTF::LazyDict<glTF::Image>::Create(&peVar10->images,(string *)local_538);
        pTVar12 = glTF::Ref<glTF::Texture>::operator->(&prop->texture);
        (pTVar12->source).index = RVar15.index;
        (pTVar12->source).vector = RVar15.vector;
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_468);
        if (*pcVar7 == '*') {
          ppaVar1 = this->mScene->mTextures;
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_468);
          iVar6 = atoi(pcVar7);
          paVar2 = ppaVar1[iVar6];
          mimeType.field_2._8_8_ = paVar2->pcData;
          pTVar12 = glTF::Ref<glTF::Texture>::operator->(&prop->texture);
          pIVar13 = glTF::Ref<glTF::Image>::operator->(&pTVar12->source);
          data_00 = mimeType.field_2._8_8_;
          uVar4 = paVar2->mWidth;
          peVar10 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->mAsset);
          glTF::Image::SetData(pIVar13,(uint8_t *)data_00,(ulong)uVar4,peVar10);
          if (paVar2->achFormatHint[0] != '\0') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_5b0,"image/",&local_5b1);
            std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
            iVar6 = memcmp(paVar2->achFormatHint,"jpg",3);
            if (iVar6 == 0) {
              local_698 = "jpeg";
            }
            else {
              local_698 = paVar2->achFormatHint;
            }
            std::__cxx11::string::operator+=(local_5b0,local_698);
            pTVar12 = glTF::Ref<glTF::Texture>::operator->(&prop->texture);
            pIVar13 = glTF::Ref<glTF::Image>::operator->(&pTVar12->source);
            std::__cxx11::string::operator=((string *)&pIVar13->mimeType,local_5b0);
            std::__cxx11::string::~string(local_5b0);
          }
        }
        else {
          pTVar12 = glTF::Ref<glTF::Texture>::operator->(&prop->texture);
          pIVar13 = glTF::Ref<glTF::Image>::operator->(&pTVar12->source);
          std::__cxx11::string::operator=((string *)&pIVar13->uri,(string *)local_468);
        }
        GetTexSampler(this,mat,prop);
        std::__cxx11::string::~string((string *)local_538);
        std::__cxx11::string::~string((string *)local_4d0);
      }
    }
    std::__cxx11::string::~string((string *)local_468);
  }
  aVar5 = aiMaterial::Get(mat,propName,type,idx,(aiColor4D *)((long)&path.field_2 + 0xc));
  if (aVar5 == aiReturn_SUCCESS) {
    prop->color[0] = (float)path.field_2._12_4_;
    prop->color[1] = local_440;
    prop->color[2] = col.r;
    prop->color[3] = col.g;
  }
  return;
}

Assistant:

void glTFExporter::GetMatColorOrTex(const aiMaterial* mat, glTF::TexProperty& prop, const char* propName, int type, int idx, aiTextureType tt)
{
    aiString tex;
    aiColor4D col;
    if (mat->GetTextureCount(tt) > 0) {
        if (mat->Get(AI_MATKEY_TEXTURE(tt, 0), tex) == AI_SUCCESS) {
            std::string path = tex.C_Str();

            if (path.size() > 0) {
                if (path[0] != '*') {
                    std::map<std::string, unsigned int>::iterator it = mTexturesByPath.find(path);
                    if (it != mTexturesByPath.end()) {
                        prop.texture = mAsset->textures.Get(it->second);
                    }
                }

                if (!prop.texture) {
                    std::string texId = mAsset->FindUniqueID("", "texture");
                    prop.texture = mAsset->textures.Create(texId);
                    mTexturesByPath[path] = prop.texture.GetIndex();

                    std::string imgId = mAsset->FindUniqueID("", "image");
                    prop.texture->source = mAsset->images.Create(imgId);

                    if (path[0] == '*') { // embedded
                        aiTexture* tex = mScene->mTextures[atoi(&path[1])];

                        uint8_t* data = reinterpret_cast<uint8_t*>(tex->pcData);
                        prop.texture->source->SetData(data, tex->mWidth, *mAsset);

                        if (tex->achFormatHint[0]) {
                            std::string mimeType = "image/";
                            mimeType += (memcmp(tex->achFormatHint, "jpg", 3) == 0) ? "jpeg" : tex->achFormatHint;
                            prop.texture->source->mimeType = mimeType;
                        }
                    }
                    else {
                        prop.texture->source->uri = path;
                    }

                    GetTexSampler(mat, prop);
                }
            }
        }
    }

    if (mat->Get(propName, type, idx, col) == AI_SUCCESS) {
        prop.color[0] = col.r; prop.color[1] = col.g; prop.color[2] = col.b; prop.color[3] = col.a;
    }
}